

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VideoHppGenerator.cpp
# Opt level: O3

string * __thiscall
VideoHppGenerator::generateEnums
          (string *__return_storage_ptr__,VideoHppGenerator *this,RequireData *requireData,
          string *title)

{
  pointer pbVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  const_iterator cVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  VideoHppGenerator *this_00;
  pointer __k;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  string *local_78;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::EnumData>
  local_70;
  
  local_80 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_80;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  __k = (requireData->types).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (requireData->types).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__k != pbVar1) {
    local_78 = title;
    do {
      cVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::EnumData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::EnumData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::EnumData>_>_>
              ::find(&(this->m_enums)._M_t,__k);
      if ((_Rb_tree_header *)cVar3._M_node != &(this->m_enums)._M_t._M_impl.super__Rb_tree_header) {
        this_00 = (VideoHppGenerator *)(cVar3._M_node + 1);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::EnumData>
        ::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::EnumData,_true>
                  (&local_70,
                   (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::EnumData>
                    *)this_00);
        generateEnum(&local_a0,this_00,&local_70);
        pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 replace(&local_a0,0,0,"\n",1);
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar4->_M_dataplus)._M_p;
        paVar5 = &pbVar4->field_2;
        if (paVar2 == paVar5) {
          local_c0.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
          local_c0.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
        }
        else {
          local_c0.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
          local_c0._M_dataplus._M_p = (pointer)paVar2;
        }
        local_c0._M_string_length = pbVar4->_M_string_length;
        (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
        pbVar4->_M_string_length = 0;
        (pbVar4->field_2)._M_local_buf[0] = '\0';
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (__return_storage_ptr__,local_c0._M_dataplus._M_p,local_c0._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
        std::
        vector<VideoHppGenerator::EnumValueData,_std::allocator<VideoHppGenerator::EnumValueData>_>
        ::~vector(&local_70.second.values);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70.first._M_dataplus._M_p != &local_70.first.field_2) {
          operator_delete(local_70.first._M_dataplus._M_p,
                          local_70.first.field_2._M_allocated_capacity + 1);
        }
      }
      __k = __k + 1;
    } while (__k != pbVar1);
    if (__return_storage_ptr__->_M_string_length != 0) {
      std::operator+(&local_a0,"\n    //=== ",local_78);
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_a0," ===\n");
      paVar2 = &local_70.first.field_2;
      local_c0._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
      paVar5 = &pbVar4->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p == paVar5) {
        local_c0.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
        local_c0.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      }
      else {
        local_c0.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
      }
      local_c0._M_string_length = pbVar4->_M_string_length;
      (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
      pbVar4->_M_string_length = 0;
      (pbVar4->field_2)._M_local_buf[0] = '\0';
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               _M_append(&local_c0,(__return_storage_ptr__->_M_dataplus)._M_p,
                         __return_storage_ptr__->_M_string_length);
      local_70.first._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
      paVar5 = &pbVar4->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.first._M_dataplus._M_p == paVar5) {
        local_70.first.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
        local_70.first.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
        local_70.first._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_70.first.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
      }
      local_70.first._M_string_length = pbVar4->_M_string_length;
      (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
      pbVar4->_M_string_length = 0;
      (pbVar4->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (__return_storage_ptr__,&local_70.first);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.first._M_dataplus._M_p != paVar2) {
        operator_delete(local_70.first._M_dataplus._M_p,
                        local_70.first.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VideoHppGenerator::generateEnums( RequireData const & requireData, std::string const & title ) const
{
  std::string str;
  for ( auto const & type : requireData.types )
  {
    auto enumIt = m_enums.find( type );
    if ( enumIt != m_enums.end() )
    {
      str += "\n" + generateEnum( *enumIt );
    }
  }
  if ( !str.empty() )
  {
    str = "\n    //=== " + title + " ===\n" + str;
  }
  return str;
}